

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool doctest::anon_unknown_14::parseIntOption
               (int argc,char **argv,char *pattern,optionType type,int *res)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  anon_union_24_2_13149d16_for_String_2 *value;
  char *other;
  String parsedValue;
  anon_union_24_2_13149d16_for_String_2 local_60;
  anon_union_24_2_13149d16_for_String_2 local_48;
  
  value = &local_60;
  local_60.buf[0] = '\0';
  local_60.buf[0x17] = '\x17';
  local_48.buf[0] = '\0';
  local_48.buf[0x17] = '\x17';
  bVar1 = parseOption(argc,argv,pattern,(String *)&value->data,(String *)&local_48.data);
  if ((local_48.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_48._1_7_,local_48.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_48._1_7_,local_48.buf[0]));
  }
  if (bVar1) {
    if (type == option_bool) {
      other = "1";
      lVar4 = 0;
      iVar2 = 1;
      do {
        iVar3 = String::compare((String *)&local_60.data,other,true);
        if (iVar3 == 0) goto LAB_0010b818;
        iVar3 = String::compare((String *)&local_60.data,&DAT_001550c0 + lVar4,true);
        if (iVar3 == 0) {
          iVar2 = 0;
          goto LAB_0010b818;
        }
        other = other + 5;
        lVar4 = lVar4 + 6;
      } while (lVar4 != 0x18);
    }
    else {
      if (local_60.buf[0x17] < '\0') {
        value = (anon_union_24_2_13149d16_for_String_2 *)CONCAT71(local_60._1_7_,local_60.buf[0]);
      }
      iVar2 = atoi(value->buf);
      if (iVar2 != 0) {
LAB_0010b818:
        *res = iVar2;
        bVar1 = true;
        goto LAB_0010b81c;
      }
    }
  }
  bVar1 = false;
LAB_0010b81c:
  if ((local_60.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_60._1_7_,local_60.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_60._1_7_,local_60.buf[0]));
  }
  return bVar1;
}

Assistant:

bool parseIntOption(int argc, const char* const* argv, const char* pattern, optionType type,
                        int& res) {
        String parsedValue;
        if(!parseOption(argc, argv, pattern, &parsedValue))
            return false;

        if(type == 0) {
            // boolean
            const char positive[][5] = {"1", "true", "on", "yes"};  // 5 - strlen("true") + 1
            const char negative[][6] = {"0", "false", "off", "no"}; // 6 - strlen("false") + 1

            // if the value matches any of the positive/negative possibilities
            for(unsigned i = 0; i < 4; i++) {
                if(parsedValue.compare(positive[i], true) == 0) {
                    res = 1; //!OCLINT parameter reassignment
                    return true;
                }
                if(parsedValue.compare(negative[i], true) == 0) {
                    res = 0; //!OCLINT parameter reassignment
                    return true;
                }
            }
        } else {
            // integer
            // TODO: change this to use std::stoi or something else! currently it uses undefined behavior - assumes '0' on failed parse...
            int theInt = std::atoi(parsedValue.c_str()); // NOLINT
            if(theInt != 0) {
                res = theInt; //!OCLINT parameter reassignment
                return true;
            }
        }
        return false;
    }